

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::SamHeaderValidator::ValidateSequenceDictionary(SamHeaderValidator *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  SamSequenceConstIterator SVar4;
  SamSequenceConstIterator SVar5;
  SamSequenceDictionary *this_00;
  SamSequence *seq;
  
  bVar1 = ContainsUniqueSequenceNames(this);
  this_00 = &this->m_header->Sequences;
  SVar4 = SamSequenceDictionary::ConstBegin(this_00);
  SVar5 = SamSequenceDictionary::ConstEnd(this_00);
  for (; SVar4._M_current != SVar5._M_current; SVar4._M_current = SVar4._M_current + 1) {
    bVar2 = CheckNameFormat(this,&(SVar4._M_current)->Name);
    bVar3 = CheckLengthInRange(this,&(SVar4._M_current)->Length);
    bVar1 = (bool)(bVar1 & (bVar3 && bVar2));
  }
  return bVar1;
}

Assistant:

bool SamHeaderValidator::ValidateSequenceDictionary()
{

    bool isValid = true;

    // check for unique sequence names
    isValid &= ContainsUniqueSequenceNames();

    // iterate over sequences
    const SamSequenceDictionary& sequences = m_header.Sequences;
    SamSequenceConstIterator seqIter = sequences.ConstBegin();
    SamSequenceConstIterator seqEnd = sequences.ConstEnd();
    for (; seqIter != seqEnd; ++seqIter) {
        const SamSequence& seq = (*seqIter);
        isValid &= ValidateSequence(seq);
    }

    // return validation state
    return isValid;
}